

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDefList.cpp
# Opt level: O1

XMLAttDef * __thiscall
xercesc_4_0::DTDAttDefList::findAttDef(DTDAttDefList *this,uint param_1,XMLCh *attName)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  DTDAttDef *pDVar4;
  XMLCh *pXVar5;
  XMLCh XVar6;
  RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *pRVar7;
  
  pRVar1 = this->fList;
  if ((attName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*attName, uVar3 == 0)) {
    uVar3 = 0;
  }
  else {
    XVar6 = attName[1];
    if (XVar6 != L'\0') {
      pXVar5 = attName + 2;
      do {
        uVar3 = (ulong)(ushort)XVar6 + (uVar3 >> 0x18) + uVar3 * 0x26;
        XVar6 = *pXVar5;
        pXVar5 = pXVar5 + 1;
      } while (XVar6 != L'\0');
    }
    uVar3 = uVar3 % pRVar1->fHashModulus;
  }
  pRVar7 = pRVar1->fBucketList[uVar3];
  if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0) {
    do {
      bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,attName,pRVar7->fKey);
      if (bVar2) goto LAB_00307064;
      pRVar7 = pRVar7->fNext;
    } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0);
  }
  pRVar7 = (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0;
LAB_00307064:
  if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0) {
    pDVar4 = (DTDAttDef *)0x0;
  }
  else {
    pDVar4 = pRVar7->fData;
  }
  return &pDVar4->super_XMLAttDef;
}

Assistant:

const XMLAttDef*
DTDAttDefList::findAttDef(  const   unsigned int
                            , const XMLCh* const    attName) const
{
    // We don't use the URI, so we just look up the name
    return fList->get(attName);
}